

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

int numbertocolor(int n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = 0;
  }
  uVar1 = (int)(uVar4 / 100) << 5;
  if (0xfe < uVar1) {
    uVar1 = 0xff;
  }
  uVar2 = (int)((uVar4 / 10) % 10) << 5;
  if (0xfe < uVar2) {
    uVar2 = 0xff;
  }
  uVar3 = (int)(uVar4 % 10) << 5;
  if (0xfe < uVar3) {
    uVar3 = 0xff;
  }
  return uVar3 | uVar1 << 0x10 | uVar2 << 8;
}

Assistant:

static int numbertocolor(int n)
{
    int red, blue, green, color = 0;
    if (n < 0) n = 0;
    red = n / 100;
    blue = ((n / 10) % 10);
    green = n % 10;
    color |= rangecolor(red)   << 16;
    color |= rangecolor(blue)  <<  8;
    color |= rangecolor(green) <<  0;
    return color;
}